

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_builder.h
# Opt level: O3

MyGame_Example_Any_union_ref_t
MyGame_Example_Any_clone(flatbuffers_builder_t *B,MyGame_Example_Any_union_t u)

{
  uint uVar1;
  int iVar2;
  flatcc_refmap_ref_t fVar3;
  long lVar4;
  flatcc_builder_ref_t *pfVar5;
  void *pvVar6;
  Fantasy_Character_union_ref_t FVar7;
  flatcc_builder_utype_t *pfVar8;
  ushort uVar9;
  uint uVar10;
  MyGame_Example_Monster_table_t t;
  MyGame_Example_Monster_table_t src;
  MyGame_Example_Monster_table_t pMVar11;
  MyGame_Example_TestJSONPrefixParsing_table_t t_00;
  MyGame_Example_Monster_table_t pMVar12;
  MyGame_Example_Any_union_ref_t MVar13;
  ulong uVar14;
  MyGame_Example_TestJSONPrefixParsing_table_t pMVar15;
  MyGame_Example_Monster_table_t pMVar16;
  MyGame_Example_Monster_table_t pMVar17;
  Fantasy_Character_union_t u_00;
  Fantasy_Character_union_t u_01;
  Fantasy_Character_union_t u_02;
  Fantasy_Character_union_t u_03;
  Fantasy_Character_union_t u_04;
  flatcc_refmap_ref_t local_44;
  size_t local_40;
  
  t = (MyGame_Example_Monster_table_t)u.value;
  switch(u._0_4_ & 0xff) {
  case 1:
    uVar1 = MyGame_Example_Monster_clone(B,t);
    MVar13 = (MyGame_Example_Any_union_ref_t)(((ulong)uVar1 << 0x20) + 1);
    break;
  case 2:
    if (B->refmap == (flatcc_refmap_t *)0x0) {
LAB_00110b5f:
      iVar2 = flatcc_builder_start_table(B,4);
      if (iVar2 == 0) {
        if (t == (MyGame_Example_Monster_table_t)0x0) {
          __assert_fail("t__tmp != 0 && \"null pointer table access\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_reader.h"
                        ,0x3ae,
                        "const MyGame_Example_Color_enum_t *MyGame_Example_TestSimpleTableWithEnum_color_get_ptr(MyGame_Example_TestSimpleTableWithEnum_table_t)"
                       );
        }
        iVar2 = *(int *)t;
        uVar9 = *(ushort *)(t + -(long)iVar2);
        if (5 < uVar9) {
          lVar4 = -(long)iVar2;
          if (*(ushort *)(t + lVar4 + 4) != 0) {
            uVar14 = 0;
            pvVar6 = flatcc_builder_table_add_copy(B,0,t + *(ushort *)(t + lVar4 + 4),1,1);
            if (pvVar6 == (void *)0x0) goto LAB_001111c3;
            iVar2 = *(int *)t;
            lVar4 = -(long)iVar2;
            uVar9 = *(ushort *)(t + -(long)iVar2);
          }
          if (7 < uVar9) {
            if (*(ushort *)(t + lVar4 + 6) != 0) {
              pvVar6 = flatcc_builder_table_add_copy(B,1,t + *(ushort *)(t + lVar4 + 6),1,1);
              if (pvVar6 == (void *)0x0) goto LAB_00110b74;
              iVar2 = *(int *)t;
              lVar4 = -(long)iVar2;
              uVar9 = *(ushort *)(t + -(long)iVar2);
            }
            if ((9 < uVar9) && (*(ushort *)(t + lVar4 + 8) != 0)) {
              pvVar6 = flatcc_builder_table_add_copy(B,2,t + *(ushort *)(t + lVar4 + 8),1,1);
              if (pvVar6 == (void *)0x0) goto LAB_00110b74;
              iVar2 = *(int *)t;
            }
          }
        }
        if ((0xb < *(ushort *)(t + -(long)iVar2)) && (*(ushort *)(t + (10 - (long)iVar2)) != 0)) {
          pvVar6 = flatcc_builder_table_add_copy(B,3,t + *(ushort *)(t + (10 - (long)iVar2)),1,1);
          uVar14 = 0;
          if (pvVar6 == (void *)0x0) goto LAB_001111c3;
        }
        iVar2 = flatcc_builder_check_required(B,__MyGame_Example_TestSimpleTableWithEnum_required,0)
        ;
        if (iVar2 == 0) {
          __assert_fail("flatcc_builder_check_required(B, __MyGame_Example_TestSimpleTableWithEnum_required, sizeof(__MyGame_Example_TestSimpleTableWithEnum_required) / sizeof(__MyGame_Example_TestSimpleTableWithEnum_required[0]) - 1)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_builder.h"
                        ,0x117,
                        "MyGame_Example_TestSimpleTableWithEnum_ref_t MyGame_Example_TestSimpleTableWithEnum_end(flatbuffers_builder_t *)"
                       );
        }
        uVar1 = flatcc_builder_end_table(B);
        uVar14 = (ulong)uVar1;
        if (B->refmap != (flatcc_refmap_t *)0x0) {
          uVar1 = flatcc_refmap_insert(B->refmap,t,uVar1);
          uVar14 = (ulong)uVar1;
        }
      }
      else {
LAB_00110b74:
        uVar14 = 0;
      }
    }
    else {
      uVar1 = flatcc_refmap_find(B->refmap,t);
      uVar14 = (ulong)uVar1;
      if (uVar1 == 0) goto LAB_00110b5f;
    }
LAB_001111c3:
    MVar13 = (MyGame_Example_Any_union_ref_t)(uVar14 << 0x20 | 2);
    break;
  case 3:
    if (B->refmap == (flatcc_refmap_t *)0x0) {
LAB_00110aa8:
      uVar14 = 0;
      iVar2 = flatcc_builder_start_table(B,0);
      if (iVar2 == 0) {
        iVar2 = flatcc_builder_check_required(B,__MyGame_Example2_Monster_required,0);
        if (iVar2 == 0) {
          __assert_fail("flatcc_builder_check_required(B, __MyGame_Example2_Monster_required, sizeof(__MyGame_Example2_Monster_required) / sizeof(__MyGame_Example2_Monster_required[0]) - 1)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_builder.h"
                        ,0x108,
                        "MyGame_Example2_Monster_ref_t MyGame_Example2_Monster_end(flatbuffers_builder_t *)"
                       );
        }
        uVar1 = flatcc_builder_end_table(B);
        uVar14 = (ulong)uVar1;
        if (B->refmap != (flatcc_refmap_t *)0x0) {
          uVar1 = flatcc_refmap_insert(B->refmap,t,uVar1);
          uVar14 = (ulong)uVar1;
        }
      }
    }
    else {
      uVar1 = flatcc_refmap_find(B->refmap,t);
      uVar14 = (ulong)uVar1;
      if (uVar1 == 0) goto LAB_00110aa8;
    }
    MVar13 = (MyGame_Example_Any_union_ref_t)(uVar14 << 0x20 | 3);
    break;
  case 4:
    if (B->refmap != (flatcc_refmap_t *)0x0) {
      uVar1 = flatcc_refmap_find(B->refmap,t);
      uVar14 = (ulong)uVar1;
      if (uVar1 == 0) goto LAB_00110b1f;
      goto LAB_00110b33;
    }
LAB_00110b1f:
    iVar2 = flatcc_builder_start_table(B,9);
    if (iVar2 != 0) goto LAB_00110b30;
    if (t == (MyGame_Example_Monster_table_t)0x0) {
      __assert_fail("t__tmp != 0 && \"null pointer table access\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_reader.h"
                    ,0x3d6,
                    "MyGame_Example_TestJSONPrefix_table_t MyGame_Example_Alt_prefix_get(MyGame_Example_Alt_table_t)"
                   );
    }
    lVar4 = -(long)*(int *)t;
    if ((*(ushort *)(t + -(long)*(int *)t) < 6) ||
       (uVar14 = (ulong)*(ushort *)(t + lVar4 + 4), uVar14 == 0)) {
LAB_00110f5b:
      if ((*(ushort *)(t + lVar4) < 8) || (uVar14 = (ulong)*(ushort *)(t + lVar4 + 6), uVar14 == 0))
      {
LAB_00110fb1:
        iVar2 = MyGame_Example_Alt_manyany_pick(B,(MyGame_Example_Alt_table_t)t);
        if ((((iVar2 != 0) ||
             (iVar2 = MyGame_Example_Alt_multik_pick(B,(MyGame_Example_Alt_table_t)t), iVar2 != 0))
            || (iVar2 = MyGame_Example_Alt_rapunzels_pick(B,(MyGame_Example_Alt_table_t)t),
               iVar2 != 0)) ||
           ((iVar2 = MyGame_Example_Alt_names_pick(B,(MyGame_Example_Alt_table_t)t), iVar2 != 0 ||
            (iVar2 = MyGame_Example_Alt_samples_pick(B,(MyGame_Example_Alt_table_t)t), iVar2 != 0)))
           ) goto LAB_00110b30;
        iVar2 = MyGame_Example_Alt_fixed_array_pick(B,(MyGame_Example_Alt_table_t)t);
        uVar14 = 0;
        if (iVar2 == 0) {
          uVar1 = MyGame_Example_Alt_end(B);
          uVar14 = (ulong)uVar1;
          if (B->refmap != (flatcc_refmap_t *)0x0) {
            uVar1 = flatcc_refmap_insert(B->refmap,t,uVar1);
            uVar14 = (ulong)uVar1;
          }
        }
      }
      else {
        pMVar17 = t + *(uint *)(t + uVar14) + uVar14;
        if ((B->refmap != (flatcc_refmap_t *)0x0) &&
           (fVar3 = flatcc_refmap_find(B->refmap,pMVar17), fVar3 != 0)) {
LAB_00110f99:
          pfVar5 = flatcc_builder_table_add_offset(B,1);
          if (pfVar5 == (flatcc_builder_ref_t *)0x0) goto LAB_00110b30;
          *pfVar5 = fVar3;
          goto LAB_00110fb1;
        }
        iVar2 = flatcc_builder_start_table(B,10);
        if (iVar2 != 0) goto LAB_00110b30;
        if (5 < *(ushort *)(pMVar17 + -(long)*(int *)pMVar17)) {
          lVar4 = -(long)*(int *)pMVar17;
          if (((ulong)*(ushort *)(pMVar17 + lVar4 + 4) == 0) ||
             (pMVar17[*(ushort *)(pMVar17 + lVar4 + 4)].unused__ == 0)) goto LAB_0011165b;
          if ((*(ushort *)(pMVar17 + -(long)*(int *)pMVar17) < 8) ||
             (uVar14 = (ulong)*(ushort *)(pMVar17 + lVar4 + 6), uVar14 == 0)) {
            pMVar12 = (MyGame_Example_Monster_table_t)0x0;
          }
          else {
            pMVar12 = pMVar17 + *(uint *)(pMVar17 + uVar14) + uVar14;
          }
          u_00._1_7_ = 0;
          u_00.type = pMVar17[*(ushort *)(pMVar17 + lVar4 + 4)].unused__;
          u_00.value = pMVar12;
          FVar7 = Fantasy_Character_clone(B,u_00);
          if (FVar7.type == '\0') goto LAB_0011165b;
          if ((ulong)FVar7 >> 0x20 == 0) goto LAB_00110b30;
          uVar14 = 0;
          pfVar8 = (flatcc_builder_utype_t *)flatcc_builder_table_add(B,0,1,1);
          if (pfVar8 != (flatcc_builder_utype_t *)0x0) {
            *pfVar8 = FVar7.type;
            pfVar5 = flatcc_builder_table_add_offset(B,1);
            if (pfVar5 != (flatcc_builder_ref_t *)0x0) {
              *pfVar5 = FVar7.value;
              goto LAB_0011165b;
            }
          }
          goto LAB_00110b33;
        }
LAB_0011165b:
        if (9 < *(ushort *)(pMVar17 + -(long)*(int *)pMVar17)) {
          lVar4 = -(long)*(int *)pMVar17;
          if (((ulong)*(ushort *)(pMVar17 + lVar4 + 8) == 0) ||
             (pMVar17[*(ushort *)(pMVar17 + lVar4 + 8)].unused__ == 0)) goto LAB_00111709;
          if ((*(ushort *)(pMVar17 + -(long)*(int *)pMVar17) < 0xc) ||
             (uVar14 = (ulong)*(ushort *)(pMVar17 + lVar4 + 10), uVar14 == 0)) {
            pMVar12 = (MyGame_Example_Monster_table_t)0x0;
          }
          else {
            pMVar12 = pMVar17 + *(uint *)(pMVar17 + uVar14) + uVar14;
          }
          u_01._1_7_ = 0;
          u_01.type = pMVar17[*(ushort *)(pMVar17 + lVar4 + 8)].unused__;
          u_01.value = pMVar12;
          FVar7 = Fantasy_Character_clone(B,u_01);
          if (FVar7.type == '\0') goto LAB_00111709;
          uVar14 = 0;
          if (((ulong)FVar7 >> 0x20 != 0) &&
             (pfVar8 = (flatcc_builder_utype_t *)flatcc_builder_table_add(B,2,1,1),
             pfVar8 != (flatcc_builder_utype_t *)0x0)) {
            *pfVar8 = FVar7.type;
            pfVar5 = flatcc_builder_table_add_offset(B,3);
            if (pfVar5 != (flatcc_builder_ref_t *)0x0) {
              *pfVar5 = FVar7.value;
              goto LAB_00111709;
            }
          }
          goto LAB_00110b33;
        }
LAB_00111709:
        if (0xd < *(ushort *)(pMVar17 + -(long)*(int *)pMVar17)) {
          lVar4 = -(long)*(int *)pMVar17;
          if (((ulong)*(ushort *)(pMVar17 + lVar4 + 0xc) == 0) ||
             (pMVar17[*(ushort *)(pMVar17 + lVar4 + 0xc)].unused__ == 0)) goto LAB_001117b7;
          if ((*(ushort *)(pMVar17 + -(long)*(int *)pMVar17) < 0x10) ||
             (uVar14 = (ulong)*(ushort *)(pMVar17 + lVar4 + 0xe), uVar14 == 0)) {
            pMVar12 = (MyGame_Example_Monster_table_t)0x0;
          }
          else {
            pMVar12 = pMVar17 + *(uint *)(pMVar17 + uVar14) + uVar14;
          }
          u_02._1_7_ = 0;
          u_02.type = pMVar17[*(ushort *)(pMVar17 + lVar4 + 0xc)].unused__;
          u_02.value = pMVar12;
          FVar7 = Fantasy_Character_clone(B,u_02);
          if (FVar7.type == '\0') goto LAB_001117b7;
          uVar14 = 0;
          if (((ulong)FVar7 >> 0x20 != 0) &&
             (pfVar8 = (flatcc_builder_utype_t *)flatcc_builder_table_add(B,4,1,1),
             pfVar8 != (flatcc_builder_utype_t *)0x0)) {
            *pfVar8 = FVar7.type;
            pfVar5 = flatcc_builder_table_add_offset(B,5);
            if (pfVar5 != (flatcc_builder_ref_t *)0x0) {
              *pfVar5 = FVar7.value;
              goto LAB_001117b7;
            }
          }
          goto LAB_00110b33;
        }
LAB_001117b7:
        if (0x11 < *(ushort *)(pMVar17 + -(long)*(int *)pMVar17)) {
          lVar4 = -(long)*(int *)pMVar17;
          if (((ulong)*(ushort *)(pMVar17 + lVar4 + 0x10) == 0) ||
             (pMVar17[*(ushort *)(pMVar17 + lVar4 + 0x10)].unused__ == 0)) goto LAB_00111865;
          if ((*(ushort *)(pMVar17 + -(long)*(int *)pMVar17) < 0x14) ||
             (uVar14 = (ulong)*(ushort *)(pMVar17 + lVar4 + 0x12), uVar14 == 0)) {
            pMVar12 = (MyGame_Example_Monster_table_t)0x0;
          }
          else {
            pMVar12 = pMVar17 + *(uint *)(pMVar17 + uVar14) + uVar14;
          }
          u_03._1_7_ = 0;
          u_03.type = pMVar17[*(ushort *)(pMVar17 + lVar4 + 0x10)].unused__;
          u_03.value = pMVar12;
          FVar7 = Fantasy_Character_clone(B,u_03);
          if (FVar7.type == '\0') goto LAB_00111865;
          uVar14 = 0;
          if (((ulong)FVar7 >> 0x20 != 0) &&
             (pfVar8 = (flatcc_builder_utype_t *)flatcc_builder_table_add(B,6,1,1),
             pfVar8 != (flatcc_builder_utype_t *)0x0)) {
            *pfVar8 = FVar7.type;
            pfVar5 = flatcc_builder_table_add_offset(B,7);
            if (pfVar5 != (flatcc_builder_ref_t *)0x0) {
              *pfVar5 = FVar7.value;
              goto LAB_00111865;
            }
          }
          goto LAB_00110b33;
        }
LAB_00111865:
        if (*(ushort *)(pMVar17 + -(long)*(int *)pMVar17) < 0x16) {
LAB_001119c3:
          iVar2 = flatcc_builder_check_required(B,__Fantasy_Movie_required,0);
          if (iVar2 == 0) {
            __assert_fail("flatcc_builder_check_required(B, __Fantasy_Movie_required, sizeof(__Fantasy_Movie_required) / sizeof(__Fantasy_Movie_required[0]) - 1)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_builder.h"
                          ,0x158,"Fantasy_Movie_ref_t Fantasy_Movie_end(flatbuffers_builder_t *)");
          }
          fVar3 = flatcc_builder_end_table(B);
          if (B->refmap != (flatcc_refmap_t *)0x0) {
            fVar3 = flatcc_refmap_insert(B->refmap,pMVar17,fVar3);
          }
          if (fVar3 == 0) goto LAB_00110b30;
          goto LAB_00110f99;
        }
        lVar4 = -(long)*(int *)pMVar17;
        uVar14 = (ulong)*(ushort *)(pMVar17 + lVar4 + 0x14);
        if (uVar14 == 0) {
          pMVar12 = (MyGame_Example_Monster_table_t)0x0;
        }
        else {
          pMVar12 = pMVar17 + *(uint *)(pMVar17 + uVar14) + uVar14 + 4;
        }
        if ((*(ushort *)(pMVar17 + -(long)*(int *)pMVar17) < 0x18) ||
           (uVar14 = (ulong)*(ushort *)(pMVar17 + lVar4 + 0x16), uVar14 == 0)) {
          src = (MyGame_Example_Monster_table_t)0x0;
        }
        else {
          src = pMVar17 + *(uint *)(pMVar17 + uVar14) + uVar14 + 4;
        }
        if (pMVar12 == (MyGame_Example_Monster_table_t)0x0) {
          uVar1 = 0;
        }
        else {
          uVar1 = *(uint *)(pMVar12 + -4);
        }
        if (src == (MyGame_Example_Monster_table_t)0x0) {
          uVar10 = 0;
        }
        else {
          uVar10 = *(uint *)(src + -4);
        }
        if (uVar1 != uVar10) {
          __assert_fail("flatbuffers_vec_len(uv__tmp.type) == flatbuffers_vec_len(uv__tmp.value) && \"union vector type length mismatch\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_reader.h"
                        ,0x4bc,
                        "Fantasy_Character_union_vec_t Fantasy_Movie_characters_union(Fantasy_Movie_table_t)"
                       );
        }
        if (pMVar12 == (MyGame_Example_Monster_table_t)0x0) goto LAB_001119c3;
        if (B->refmap == (flatcc_refmap_t *)0x0) {
          local_40 = (size_t)*(uint *)(pMVar12 + -4);
          iVar2 = 0;
LAB_00111948:
          local_44 = flatcc_builder_create_type_vector(B,&pMVar12->unused__,local_40);
          if (B->refmap != (flatcc_refmap_t *)0x0) {
            local_44 = flatcc_refmap_insert(B->refmap,pMVar12,local_44);
          }
          if (local_44 == 0) goto LAB_001119c3;
        }
        else {
          local_44 = flatcc_refmap_find(B->refmap,pMVar12);
          if (B->refmap == (flatcc_refmap_t *)0x0) {
            iVar2 = 0;
          }
          else {
            iVar2 = flatcc_refmap_find(B->refmap,src);
          }
          local_40 = (size_t)*(uint *)(pMVar12 + -4);
          if (local_44 == 0) goto LAB_00111948;
        }
        if (iVar2 == 0) {
          iVar2 = flatcc_builder_start_offset_vector(B);
          if (iVar2 == 0) {
            if (local_40 != 0) {
              uVar14 = 0;
              pMVar16 = src;
              do {
                if (*(uint *)(pMVar12 + -4) <= uVar14) {
                  __assert_fail("n__tmp > (i__tmp) && \"index out of range\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_reader.h"
                                ,0x48a,
                                "Fantasy_Character_union_t Fantasy_Character_union_vec_at(Fantasy_Character_union_vec_t, size_t)"
                               );
                }
                if (pMVar12[uVar14].unused__ == 0) {
                  pMVar11 = (MyGame_Example_Monster_table_t)0x0;
                }
                else {
                  if ((src == (MyGame_Example_Monster_table_t)0x0) ||
                     (*(uint *)(src + -4) <= uVar14)) {
                    __assert_fail("flatbuffers_vec_len(vec) > (i) && \"index out of range\"",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/flatbuffers_common_reader.h"
                                  ,0x93,
                                  "flatbuffers_generic_t flatbuffers_generic_vec_at(flatbuffers_generic_vec_t, size_t)"
                                 );
                  }
                  pMVar11 = pMVar16 + *(uint *)pMVar16;
                }
                u_04._1_7_ = 0;
                u_04.type = pMVar12[uVar14].unused__;
                u_04.value = pMVar11;
                FVar7 = Fantasy_Character_clone(B,u_04);
                if (((ulong)FVar7 >> 0x20 == 0) ||
                   (pfVar5 = flatcc_builder_offset_vector_push(B,FVar7.value),
                   pfVar5 == (flatcc_builder_ref_t *)0x0)) goto LAB_001119c3;
                uVar14 = uVar14 + 1;
                pMVar16 = pMVar16 + 4;
              } while (local_40 != uVar14);
            }
            iVar2 = flatcc_builder_end_offset_vector(B);
            if (B->refmap != (flatcc_refmap_t *)0x0) {
              iVar2 = flatcc_refmap_insert(B->refmap,src,iVar2);
            }
            if (iVar2 != 0) goto LAB_0011197b;
          }
          goto LAB_001119c3;
        }
LAB_0011197b:
        pfVar5 = flatcc_builder_table_add_offset(B,8);
        uVar14 = 0;
        if (pfVar5 != (flatcc_builder_ref_t *)0x0) {
          *pfVar5 = local_44;
          pfVar5 = flatcc_builder_table_add_offset(B,9);
          if (pfVar5 != (flatcc_builder_ref_t *)0x0) {
            *pfVar5 = iVar2;
            goto LAB_001119c3;
          }
        }
      }
    }
    else {
      pMVar17 = t + *(uint *)(t + uVar14) + uVar14;
      if ((B->refmap != (flatcc_refmap_t *)0x0) &&
         (fVar3 = flatcc_refmap_find(B->refmap,pMVar17), fVar3 != 0)) {
LAB_00110f3d:
        uVar14 = 0;
        pfVar5 = flatcc_builder_table_add_offset(B,0);
        if (pfVar5 == (flatcc_builder_ref_t *)0x0) goto LAB_00110b33;
        *pfVar5 = fVar3;
        lVar4 = -(long)*(int *)t;
        goto LAB_00110f5b;
      }
      iVar2 = flatcc_builder_start_table(B,3);
      if (iVar2 != 0) goto LAB_00110b30;
      uVar9 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
      if (uVar9 < 6) {
LAB_00110efa:
        iVar2 = flatcc_builder_check_required(B,__MyGame_Example_TestJSONPrefix_required,0);
        if (iVar2 == 0) {
          __assert_fail("flatcc_builder_check_required(B, __MyGame_Example_TestJSONPrefix_required, sizeof(__MyGame_Example_TestJSONPrefix_required) / sizeof(__MyGame_Example_TestJSONPrefix_required[0]) - 1)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_builder.h"
                        ,299,
                        "MyGame_Example_TestJSONPrefix_ref_t MyGame_Example_TestJSONPrefix_end(flatbuffers_builder_t *)"
                       );
        }
        fVar3 = flatcc_builder_end_table(B);
        if (B->refmap != (flatcc_refmap_t *)0x0) {
          fVar3 = flatcc_refmap_insert(B->refmap,pMVar17,fVar3);
        }
        if (fVar3 != 0) goto LAB_00110f3d;
      }
      else {
        lVar4 = -(long)*(int *)pMVar17;
        uVar14 = (ulong)*(ushort *)(pMVar17 + lVar4 + 4);
        if (uVar14 != 0) {
          t_00 = (MyGame_Example_TestJSONPrefixParsing_table_t)
                 (pMVar17 + *(uint *)(pMVar17 + uVar14) + uVar14);
          if ((B->refmap != (flatcc_refmap_t *)0x0) &&
             (fVar3 = flatcc_refmap_find(B->refmap,t_00), fVar3 != 0)) {
LAB_00110c40:
            uVar14 = 0;
            pfVar5 = flatcc_builder_table_add_offset(B,0);
            if (pfVar5 == (flatcc_builder_ref_t *)0x0) goto LAB_00110b33;
            *pfVar5 = fVar3;
            lVar4 = -(long)*(int *)pMVar17;
            uVar9 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
            goto LAB_00110c67;
          }
          iVar2 = flatcc_builder_start_table(B,9);
          if (iVar2 == 0) {
            iVar2 = *(int *)t_00;
            uVar9 = *(ushort *)(t_00 + -(long)iVar2);
            if (0xb < uVar9) {
              lVar4 = -(long)iVar2;
              if (*(ushort *)(t_00 + lVar4 + 10) != 0) {
                pvVar6 = flatcc_builder_table_add_copy
                                   (B,3,t_00 + *(ushort *)(t_00 + lVar4 + 10),8,8);
                if (pvVar6 == (void *)0x0) goto LAB_00110b30;
                iVar2 = *(int *)t_00;
                lVar4 = -(long)iVar2;
                uVar9 = *(ushort *)(t_00 + -(long)iVar2);
              }
              if (0xf < uVar9) {
                if (*(ushort *)(t_00 + lVar4 + 0xe) != 0) {
                  pvVar6 = flatcc_builder_table_add_copy
                                     (B,5,t_00 + *(ushort *)(t_00 + lVar4 + 0xe),8,8);
                  if (pvVar6 == (void *)0x0) goto LAB_00110b30;
                  iVar2 = *(int *)t_00;
                  lVar4 = -(long)iVar2;
                  uVar9 = *(ushort *)(t_00 + -(long)iVar2);
                }
                if ((0x13 < uVar9) && (*(ushort *)(t_00 + lVar4 + 0x12) != 0)) {
                  pvVar6 = flatcc_builder_table_add_copy
                                     (B,7,t_00 + *(ushort *)(t_00 + lVar4 + 0x12),8,8);
                  if (pvVar6 == (void *)0x0) goto LAB_00110b30;
                  iVar2 = *(int *)t_00;
                }
              }
            }
            uVar9 = *(ushort *)(t_00 + -(long)iVar2);
            if (5 < uVar9) {
              lVar4 = -(long)iVar2;
              uVar14 = (ulong)*(ushort *)(t_00 + lVar4 + 4);
              if (uVar14 != 0) {
                uVar1 = *(uint *)(t_00 + uVar14);
                pMVar15 = t_00 + uVar1 + uVar14 + 4;
                if ((B->refmap == (flatcc_refmap_t *)0x0) ||
                   (fVar3 = flatcc_refmap_find(B->refmap,pMVar15), fVar3 == 0)) {
                  fVar3 = flatcc_builder_create_string
                                    (B,(char *)pMVar15,(ulong)*(uint *)(t_00 + uVar1 + uVar14));
                  if (B->refmap != (flatcc_refmap_t *)0x0) {
                    fVar3 = flatcc_refmap_insert(B->refmap,pMVar15,fVar3);
                  }
                  if (fVar3 == 0) goto LAB_00110b30;
                }
                uVar14 = 0;
                pfVar5 = flatcc_builder_table_add_offset(B,0);
                if (pfVar5 == (flatcc_builder_ref_t *)0x0) goto LAB_00110b33;
                *pfVar5 = fVar3;
                iVar2 = *(int *)t_00;
                lVar4 = -(long)iVar2;
                uVar9 = *(ushort *)(t_00 + -(long)iVar2);
              }
              if (7 < uVar9) {
                if (*(ushort *)(t_00 + lVar4 + 6) != 0) {
                  pvVar6 = flatcc_builder_table_add_copy
                                     (B,1,t_00 + *(ushort *)(t_00 + lVar4 + 6),4,4);
                  if (pvVar6 == (void *)0x0) goto LAB_00110b30;
                  iVar2 = *(int *)t_00;
                  lVar4 = -(long)iVar2;
                  uVar9 = *(ushort *)(t_00 + -(long)iVar2);
                }
                if ((9 < uVar9) && (uVar14 = (ulong)*(ushort *)(t_00 + lVar4 + 8), uVar14 != 0)) {
                  uVar1 = *(uint *)(t_00 + uVar14);
                  pMVar15 = t_00 + uVar1 + uVar14 + 4;
                  if ((B->refmap == (flatcc_refmap_t *)0x0) ||
                     (fVar3 = flatcc_refmap_find(B->refmap,pMVar15), fVar3 == 0)) {
                    fVar3 = flatcc_builder_create_string
                                      (B,(char *)pMVar15,(ulong)*(uint *)(t_00 + uVar1 + uVar14));
                    if (B->refmap != (flatcc_refmap_t *)0x0) {
                      fVar3 = flatcc_refmap_insert(B->refmap,pMVar15,fVar3);
                    }
                    if (fVar3 == 0) goto LAB_00110b30;
                  }
                  pfVar5 = flatcc_builder_table_add_offset(B,2);
                  if (pfVar5 == (flatcc_builder_ref_t *)0x0) goto LAB_00110b30;
                  *pfVar5 = fVar3;
                  iVar2 = *(int *)t_00;
                }
              }
            }
            uVar9 = *(ushort *)(t_00 + -(long)iVar2);
            if (0xd < uVar9) {
              lVar4 = -(long)iVar2;
              uVar14 = (ulong)*(ushort *)(t_00 + lVar4 + 0xc);
              if (uVar14 != 0) {
                uVar1 = *(uint *)(t_00 + uVar14);
                pMVar15 = t_00 + uVar1 + uVar14 + 4;
                if ((B->refmap == (flatcc_refmap_t *)0x0) ||
                   (fVar3 = flatcc_refmap_find(B->refmap,pMVar15), fVar3 == 0)) {
                  fVar3 = flatcc_builder_create_string
                                    (B,(char *)pMVar15,(ulong)*(uint *)(t_00 + uVar1 + uVar14));
                  if (B->refmap != (flatcc_refmap_t *)0x0) {
                    fVar3 = flatcc_refmap_insert(B->refmap,pMVar15,fVar3);
                  }
                  if (fVar3 == 0) goto LAB_00110b30;
                }
                pfVar5 = flatcc_builder_table_add_offset(B,4);
                if (pfVar5 == (flatcc_builder_ref_t *)0x0) goto LAB_00110b30;
                *pfVar5 = fVar3;
                lVar4 = -(long)*(int *)t_00;
                uVar9 = *(ushort *)(t_00 + -(long)*(int *)t_00);
              }
              if (((0x11 < uVar9) && (*(ushort *)(t_00 + lVar4 + 0x10) != 0)) &&
                 (pvVar6 = flatcc_builder_table_add_copy
                                     (B,6,t_00 + *(ushort *)(t_00 + lVar4 + 0x10),4,4),
                 pvVar6 == (void *)0x0)) goto LAB_00110b30;
            }
            iVar2 = MyGame_Example_TestJSONPrefixParsing_dddd12345_pick(B,t_00);
            if (iVar2 == 0) {
              fVar3 = MyGame_Example_TestJSONPrefixParsing_end(B);
              if (B->refmap != (flatcc_refmap_t *)0x0) {
                fVar3 = flatcc_refmap_insert(B->refmap,t_00,fVar3);
              }
              if (fVar3 != 0) goto LAB_00110c40;
            }
          }
          goto LAB_00110b30;
        }
LAB_00110c67:
        if (uVar9 < 8) goto LAB_00110efa;
        uVar14 = (ulong)*(ushort *)(pMVar17 + lVar4 + 6);
        if (uVar14 != 0) {
          pMVar12 = pMVar17 + *(uint *)(pMVar17 + uVar14) + uVar14;
          if ((B->refmap == (flatcc_refmap_t *)0x0) ||
             (fVar3 = flatcc_refmap_find(B->refmap,pMVar12), fVar3 == 0)) {
            iVar2 = flatcc_builder_start_table(B,2);
            if (iVar2 == 0) {
              uVar9 = *(ushort *)(pMVar12 + -(long)*(int *)pMVar12);
              if (5 < uVar9) {
                lVar4 = -(long)*(int *)pMVar12;
                if (*(ushort *)(pMVar12 + lVar4 + 4) != 0) {
                  uVar14 = 0;
                  pvVar6 = flatcc_builder_table_add_copy
                                     (B,0,pMVar12 + *(ushort *)(pMVar12 + lVar4 + 4),8,8);
                  if (pvVar6 == (void *)0x0) goto LAB_00110b33;
                  lVar4 = -(long)*(int *)pMVar12;
                  uVar9 = *(ushort *)(pMVar12 + -(long)*(int *)pMVar12);
                }
                if (((7 < uVar9) && (*(ushort *)(pMVar12 + lVar4 + 6) != 0)) &&
                   (pvVar6 = flatcc_builder_table_add_copy
                                       (B,1,pMVar12 + *(ushort *)(pMVar12 + lVar4 + 6),4,4),
                   pvVar6 == (void *)0x0)) goto LAB_00110b30;
              }
              iVar2 = flatcc_builder_check_required
                                (B,__MyGame_Example_TestJSONPrefixParsing2_required,0);
              if (iVar2 == 0) {
                __assert_fail("flatcc_builder_check_required(B, __MyGame_Example_TestJSONPrefixParsing2_required, sizeof(__MyGame_Example_TestJSONPrefixParsing2_required) / sizeof(__MyGame_Example_TestJSONPrefixParsing2_required[0]) - 1)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_builder.h"
                              ,0x135,
                              "MyGame_Example_TestJSONPrefixParsing2_ref_t MyGame_Example_TestJSONPrefixParsing2_end(flatbuffers_builder_t *)"
                             );
              }
              fVar3 = flatcc_builder_end_table(B);
              if (B->refmap != (flatcc_refmap_t *)0x0) {
                fVar3 = flatcc_refmap_insert(B->refmap,pMVar12,fVar3);
              }
              if (fVar3 != 0) goto LAB_00110d91;
            }
          }
          else {
LAB_00110d91:
            pfVar5 = flatcc_builder_table_add_offset(B,1);
            if (pfVar5 != (flatcc_builder_ref_t *)0x0) {
              *pfVar5 = fVar3;
              lVar4 = -(long)*(int *)pMVar17;
              uVar9 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
              goto LAB_00110db8;
            }
          }
          goto LAB_00110b30;
        }
LAB_00110db8:
        if ((uVar9 < 10) || (uVar14 = (ulong)*(ushort *)(pMVar17 + lVar4 + 8), uVar14 == 0))
        goto LAB_00110efa;
        pMVar12 = pMVar17 + *(uint *)(pMVar17 + uVar14) + uVar14;
        if ((B->refmap == (flatcc_refmap_t *)0x0) ||
           (fVar3 = flatcc_refmap_find(B->refmap,pMVar12), fVar3 == 0)) {
          iVar2 = flatcc_builder_start_table(B,2);
          if (iVar2 == 0) {
            uVar9 = *(ushort *)(pMVar12 + -(long)*(int *)pMVar12);
            if (5 < uVar9) {
              lVar4 = -(long)*(int *)pMVar12;
              if (*(ushort *)(pMVar12 + lVar4 + 4) != 0) {
                uVar14 = 0;
                pvVar6 = flatcc_builder_table_add_copy
                                   (B,0,pMVar12 + *(ushort *)(pMVar12 + lVar4 + 4),8,8);
                if (pvVar6 == (void *)0x0) goto LAB_00110b33;
                lVar4 = -(long)*(int *)pMVar12;
                uVar9 = *(ushort *)(pMVar12 + -(long)*(int *)pMVar12);
              }
              if (((7 < uVar9) && (*(ushort *)(pMVar12 + lVar4 + 6) != 0)) &&
                 (pvVar6 = flatcc_builder_table_add_copy
                                     (B,1,pMVar12 + *(ushort *)(pMVar12 + lVar4 + 6),4,4),
                 pvVar6 == (void *)0x0)) goto LAB_00110b30;
            }
            iVar2 = flatcc_builder_check_required
                              (B,__MyGame_Example_TestJSONPrefixParsing3_required,0);
            if (iVar2 == 0) {
              __assert_fail("flatcc_builder_check_required(B, __MyGame_Example_TestJSONPrefixParsing3_required, sizeof(__MyGame_Example_TestJSONPrefixParsing3_required) / sizeof(__MyGame_Example_TestJSONPrefixParsing3_required[0]) - 1)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_builder.h"
                            ,0x13a,
                            "MyGame_Example_TestJSONPrefixParsing3_ref_t MyGame_Example_TestJSONPrefixParsing3_end(flatbuffers_builder_t *)"
                           );
            }
            fVar3 = flatcc_builder_end_table(B);
            if (B->refmap != (flatcc_refmap_t *)0x0) {
              fVar3 = flatcc_refmap_insert(B->refmap,pMVar12,fVar3);
            }
            if (fVar3 != 0) goto LAB_00110ee2;
          }
        }
        else {
LAB_00110ee2:
          pfVar5 = flatcc_builder_table_add_offset(B,2);
          if (pfVar5 != (flatcc_builder_ref_t *)0x0) {
            *pfVar5 = fVar3;
            goto LAB_00110efa;
          }
        }
      }
LAB_00110b30:
      uVar14 = 0;
    }
LAB_00110b33:
    MVar13 = (MyGame_Example_Any_union_ref_t)(uVar14 << 0x20 | 4);
    break;
  default:
    MVar13.type = '\0';
    MVar13._1_3_ = 0;
    MVar13.value = 0;
  }
  return MVar13;
}

Assistant:

static MyGame_Example_Any_union_ref_t MyGame_Example_Any_clone(flatbuffers_builder_t *B, MyGame_Example_Any_union_t u)
{
    switch (u.type) {
    case 1: return MyGame_Example_Any_as_Monster(MyGame_Example_Monster_clone(B, (MyGame_Example_Monster_table_t)u.value));
    case 2: return MyGame_Example_Any_as_TestSimpleTableWithEnum(MyGame_Example_TestSimpleTableWithEnum_clone(B, (MyGame_Example_TestSimpleTableWithEnum_table_t)u.value));
    case 3: return MyGame_Example_Any_as_Monster2(MyGame_Example2_Monster_clone(B, (MyGame_Example2_Monster_table_t)u.value));
    case 4: return MyGame_Example_Any_as_Alt(MyGame_Example_Alt_clone(B, (MyGame_Example_Alt_table_t)u.value));
    default: return MyGame_Example_Any_as_NONE();
    }
}